

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * phosg::escape_url(string *__return_storage_ptr__,string *s,bool escape_slash)

{
  uint uVar1;
  byte __c;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  sVar5 = 0;
  do {
    if (sVar3 == sVar5) {
      return __return_storage_ptr__;
    }
    __c = pcVar2[sVar5];
    iVar4 = isalnum((int)(char)__c);
    if (iVar4 == 0) {
      uVar1 = __c - 0x26;
      if ((((uVar1 < 0x3a) && ((0x200000000800181U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
          (__c == 0x7e)) || (__c == 0x2f && !escape_slash)) goto LAB_00114798;
      string_printf_abi_cxx11_((string *)&local_50,"%%%02hhX",(ulong)(uint)(int)(char)__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    else {
LAB_00114798:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,__c);
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

string escape_url(const string& s, bool escape_slash) {
  string ret;
  for (char ch : s) {
    if (isalnum(ch) || (ch == '-') || (ch == '_') || (ch == '.') ||
        (ch == '~') || (ch == '=') || (ch == '&') || (!escape_slash && (ch == '/'))) {
      ret += ch;
    } else {
      ret += string_printf("%%%02hhX", ch);
    }
  }
  return ret;
}